

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_protectedparser(lua_State *L,ZIO *z,char *name,char *mode)

{
  int iVar1;
  ZIO *pZStack_88;
  int status;
  SParser p;
  char *mode_local;
  char *name_local;
  ZIO *z_local;
  lua_State *L_local;
  
  L->nny = L->nny + 1;
  p.buff.buffsize = 0;
  p.dyd.actvar.arr._4_4_ = 0;
  p.dyd.actvar.n = 0;
  p.dyd.actvar.size = 0;
  p.dyd.gt.arr._4_4_ = 0;
  p.dyd.gt.n = 0;
  p.dyd.gt.size = 0;
  p.dyd.label.arr._4_4_ = 0;
  p.z = (ZIO *)0x0;
  p.buff.n = 0;
  pZStack_88 = z;
  p.dyd.label._8_8_ = mode;
  p.mode = name;
  p.name = mode;
  iVar1 = luaD_pcall(L,f_parser,&stack0xffffffffffffff78,(long)L->top - (long)L->stack,L->errfunc);
  p.z = (ZIO *)luaM_realloc_(L,p.z,p.buff.n,0);
  p.buff.n = 0;
  luaM_realloc_(L,(void *)p.buff.buffsize,(long)p.dyd.actvar.arr._4_4_ << 1,0);
  luaM_realloc_(L,(void *)p.dyd.actvar._8_8_,(long)p.dyd.gt.arr._4_4_ * 0x18,0);
  luaM_realloc_(L,(void *)p.dyd.gt._8_8_,(long)p.dyd.label.arr._4_4_ * 0x18,0);
  L->nny = L->nny - 1;
  return iVar1;
}

Assistant:

int luaD_protectedparser (lua_State *L, ZIO *z, const char *name,
                                        const char *mode) {
  struct SParser p;
  int status;
  incnny(L);  /* cannot yield during parsing */
  p.z = z; p.name = name; p.mode = mode;
  p.dyd.actvar.arr = NULL; p.dyd.actvar.size = 0;
  p.dyd.gt.arr = NULL; p.dyd.gt.size = 0;
  p.dyd.label.arr = NULL; p.dyd.label.size = 0;
  luaZ_initbuffer(L, &p.buff);
  status = luaD_pcall(L, f_parser, &p, savestack(L, L->top), L->errfunc);
  luaZ_freebuffer(L, &p.buff);
  luaM_freearray(L, p.dyd.actvar.arr, p.dyd.actvar.size);
  luaM_freearray(L, p.dyd.gt.arr, p.dyd.gt.size);
  luaM_freearray(L, p.dyd.label.arr, p.dyd.label.size);
  decnny(L);
  return status;
}